

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson-iter.c
# Opt level: O0

_Bool bson_iter_init_from_data(bson_iter_t *iter,uint8_t *data,size_t length)

{
  uint32_t len_le;
  size_t length_local;
  uint8_t *data_local;
  bson_iter_t *iter_local;
  
  if (iter == (bson_iter_t *)0x0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/src/bson/bson-iter.c"
            ,0x5d,"bson_iter_init_from_data","iter");
    abort();
  }
  if (data == (uint8_t *)0x0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/src/bson/bson-iter.c"
            ,0x5e,"bson_iter_init_from_data","data");
    abort();
  }
  if (length < 5 || 0x7fffffff < length) {
    memset(iter,0,0x50);
    iter_local._7_1_ = false;
  }
  else if (*(uint *)data == length) {
    if (data[length - 1] == '\0') {
      iter->raw = data;
      iter->len = (uint32_t)length;
      iter->off = 0;
      iter->type = 0;
      iter->key = 0;
      iter->d1 = 0;
      iter->d2 = 0;
      iter->d3 = 0;
      iter->d4 = 0;
      iter->next_off = 4;
      iter->err_off = 0;
      iter_local._7_1_ = true;
    }
    else {
      memset(iter,0,0x50);
      iter_local._7_1_ = false;
    }
  }
  else {
    memset(iter,0,0x50);
    iter_local._7_1_ = false;
  }
  return iter_local._7_1_;
}

Assistant:

bool
bson_iter_init_from_data (bson_iter_t *iter,   /* OUT */
                          const uint8_t *data, /* IN */
                          size_t length)       /* IN */
{
   uint32_t len_le;

   BSON_ASSERT (iter);
   BSON_ASSERT (data);

   if (BSON_UNLIKELY ((length < 5) || (length > INT_MAX))) {
      memset (iter, 0, sizeof *iter);
      return false;
   }

   memcpy (&len_le, data, sizeof (len_le));

   if (BSON_UNLIKELY ((size_t) BSON_UINT32_FROM_LE (len_le) != length)) {
      memset (iter, 0, sizeof *iter);
      return false;
   }

   if (BSON_UNLIKELY (data[length - 1])) {
      memset (iter, 0, sizeof *iter);
      return false;
   }

   iter->raw = (uint8_t *) data;
   iter->len = length;
   iter->off = 0;
   iter->type = 0;
   iter->key = 0;
   iter->d1 = 0;
   iter->d2 = 0;
   iter->d3 = 0;
   iter->d4 = 0;
   iter->next_off = 4;
   iter->err_off = 0;

   return true;
}